

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

double __thiscall NJamSpell::TLangModel::GetGram2Prob(TLangModel *this,TWordId word1,TWordId word2)

{
  TCount TVar1;
  TCount TVar2;
  
  TVar1 = GetGram1HashCount(this,word1);
  TVar2 = GetGram2HashCount(this,word1,word2);
  return ((double)(~-(ulong)((double)TVar1 < (double)TVar2) & (ulong)(double)TVar2) + this->K) /
         ((double)this->TotalWords + (double)TVar1);
}

Assistant:

double TLangModel::GetGram2Prob(TWordId word1, TWordId word2) const {
    double countsGram1 = GetGram1HashCount(word1);
    double countsGram2 = GetGram2HashCount(word1, word2);
    if (countsGram2 > countsGram1) { // (hash collision)
        countsGram2 = 0;
    }
    countsGram1 += TotalWords;
    countsGram2 += K;
    return countsGram2 / countsGram1;
}